

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O0

void selectionsort(int *array,int size,_func_int_void_ptr_void_ptr *comp)

{
  int iVar1;
  int local_2c;
  int tmp;
  int best_i;
  int j;
  int i;
  _func_int_void_ptr_void_ptr *comp_local;
  int size_local;
  int *array_local;
  
  for (best_i = 0; best_i < size + -1; best_i = best_i + 1) {
    local_2c = best_i;
    tmp = best_i;
    while (tmp = tmp + 1, tmp < size) {
      iVar1 = (*comp)(array + tmp,array + local_2c);
      if (iVar1 != 0) {
        local_2c = tmp;
      }
    }
    iVar1 = array[best_i];
    array[best_i] = array[local_2c];
    array[local_2c] = iVar1;
  }
  return;
}

Assistant:

static inline void selectionsort(int* array, int size, int(*comp)(const void *, const void *))
{
    int     i, j, best_i;
    int     tmp;
    for (i = 0; i < size-1; i++){
        best_i = i;
        for (j = i+1; j < size; j++){
            if (comp(array + j, array + best_i))
                best_i = j;
        }
        tmp = array[i]; array[i] = array[best_i]; array[best_i] = tmp;
    }
}